

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.h
# Opt level: O2

double __thiscall quad::pdf_value(quad *this,point3 *origin,vec3 *direction)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  hit_record rec;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  double local_68;
  double local_48;
  double dStack_40;
  double local_38;
  double local_30;
  double dStack_28;
  double local_20;
  undefined8 local_18;
  
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = origin->e[2];
  local_48 = origin->e[0];
  dStack_40 = origin->e[1];
  local_30 = direction->e[0];
  dStack_28 = direction->e[1];
  local_20 = direction->e[2];
  local_18 = 0;
  iVar3 = (*(this->super_hittable)._vptr_hittable[2])(0xd2f1a9fc,0x7ff0000000000000,this,&local_48);
  dVar5 = 0.0;
  if ((char)iVar3 != '\0') {
    dVar5 = direction->e[0];
    dVar1 = direction->e[1];
    dVar2 = direction->e[2];
    dVar4 = dVar2 * dVar2 + dVar5 * dVar5 + dVar1 * dVar1;
    dVar5 = (local_68 * local_68 * dVar4) /
            (ABS((dVar2 * 0.0 + dVar5 * 0.0 + dVar1 * 0.0) / SQRT(dVar4)) * this->area);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  return dVar5;
}

Assistant:

double pdf_value(const point3& origin, const vec3& direction) const override {
        hit_record rec;
        if (!this->hit(ray(origin, direction), interval(0.001, infinity), rec))
            return 0;

        auto distance_squared = rec.t * rec.t * direction.length_squared();
        auto cosine = std::fabs(dot(direction, rec.normal) / direction.length());

        return distance_squared / (cosine * area);
    }